

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O2

uchar * Tools::YUV2RGB(uchar *YUVData,uint dataSize)

{
  ulong uVar1;
  int iVar2;
  uchar *puVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  uint uVar7;
  uint i;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  puVar3 = (uchar *)operator_new__((ulong)(dataSize * 2));
  uVar1 = (ulong)dataSize / 6;
  iVar2 = (int)uVar1;
  pvVar4 = operator_new__((ulong)(uint)(iVar2 * 4));
  pvVar5 = operator_new__(uVar1);
  pvVar6 = operator_new__(uVar1);
  for (uVar10 = 0; dataSize != uVar10; uVar10 = uVar10 + 1) {
    if (uVar10 < (uint)(iVar2 * 4)) {
      *(uchar *)((long)pvVar4 + uVar10) = YUVData[uVar10];
    }
    else if (uVar10 < (uint)(iVar2 * 5)) {
      *(uchar *)((long)pvVar5 + (ulong)(uint)(iVar2 * -4 + (int)uVar10)) = YUVData[uVar10];
    }
    else {
      *(uchar *)((long)pvVar6 + (ulong)(uint)(iVar2 * -5 + (int)uVar10)) = YUVData[uVar10];
    }
  }
  uVar7 = 2;
  for (uVar10 = 0; uVar10 != uVar1; uVar10 = uVar10 + 1) {
    dVar11 = (double)(int)(*(byte *)((long)pvVar5 + uVar10) - 0x80);
    dVar12 = (double)(int)(*(byte *)((long)pvVar6 + uVar10) - 0x80);
    uVar8 = uVar7;
    for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
      dVar13 = (double)*(byte *)((long)pvVar4 + lVar9);
      puVar3[uVar8 - 2] = (uchar)(int)(dVar11 * 1.772 + dVar13);
      puVar3[uVar8 - 1] = (uchar)(int)(dVar12 * -0.71414 + dVar11 * -0.34414 + dVar13);
      puVar3[uVar8] = (uchar)(int)(dVar12 * 1.402 + dVar13);
      uVar8 = uVar8 + 3;
    }
    pvVar4 = (void *)((long)pvVar4 + 4);
    uVar7 = uVar7 + 0xc;
  }
  return puVar3;
}

Assistant:

uchar * Tools::YUV2RGB(uchar * YUVData, uint dataSize){

	uchar * BGR_Vector = new uchar[dataSize*2];
	uint Y_sum = 4 * (dataSize / 6), U_sum = dataSize / 6, V_sum = dataSize / 6;
	
	uchar * Y_Weight_r = new uchar[Y_sum];
	uchar * U_Weight_r = new uchar[U_sum];
	uchar * V_Weight_r = new uchar[V_sum];
	for(uint i = 0; i < dataSize; i++){
		if(i < Y_sum){
			Y_Weight_r[i] = YUVData[i];
		}else if(i < Y_sum+U_sum){
			U_Weight_r[i-Y_sum] = YUVData[i];
		}else{
			V_Weight_r[i-Y_sum-U_sum] = YUVData[i];
		}
	}


	for(uint i = 0; i < V_sum; i++){
		for(uint j = i * 4; j < i * 4 + 4; j++){

			BGR_Vector[3*j] = uchar(int(Y_Weight_r[j])+ 1.772*(int(U_Weight_r[i])-128));
	
			BGR_Vector[3*j+1] = uchar(int(Y_Weight_r[j])-0.34414*(int(U_Weight_r[i])-128)-0.71414*(int(V_Weight_r[i])-128));

			BGR_Vector[3*j+2] = uchar(int(Y_Weight_r[j])+1.402*(int(V_Weight_r[i])-128));
		}
	}
	return BGR_Vector;
}